

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall
SerialExecutionQueue::executeProcess
          (SerialExecutionQueue *this,QueueJobContext *opaqueContext,
          ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  unordered_set<llvm::StringRef,_std::hash<llvm::StringRef>,_std::equal_to<llvm::StringRef>,_std::allocator<llvm::StringRef>_>
  *this_00;
  ProcessContext *ctx;
  char **ppcVar1;
  StringRef value;
  StringRef value_00;
  StringRef key;
  StringRef value_01;
  ArrayRef<llvm::StringRef> commandLine_00;
  QueueJobContext *pQVar2;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar3;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar4;
  char **ppcVar5;
  iterator __begin1;
  StringRef key_00;
  StringRef key_01;
  StringRef Separator;
  pair<llvm::StringRef,_llvm::StringRef> pair;
  ProcessCompletionFn laneCompletionFn;
  ProcessReleaseFn releaseFn;
  POSIXEnvironment posixEnv;
  undefined1 local_1c0 [32];
  undefined1 local_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  ProcessHandle local_158;
  QueueJobContext *local_150;
  StringRef *local_148;
  size_type local_140;
  undefined4 uStack_134;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  POSIXEnvironment local_118;
  POSIXEnvironment local_a0;
  
  ppVar4 = environment.Data;
  local_140 = commandLine.Length;
  local_148 = commandLine.Data;
  if (((this->cancelled)._M_base._M_i & 1U) == 0) {
    local_118.keys._M_h._M_buckets = &local_118.keys._M_h._M_single_bucket;
    local_118.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_118.keys._M_h._M_element_count = 0;
    local_118.keys._M_h._M_bucket_count = 1;
    local_118.keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_118.keys._M_h._M_rehash_policy._4_4_ = 0;
    local_118.keys._M_h._M_rehash_policy._M_next_resize = 0;
    local_118.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_118.isFrozen = false;
    local_168 = (code *)CONCAT62(local_168._2_6_,0x109);
    local_178._0_4_ = this->buildID;
    llvm::Twine::str_abi_cxx11_((string *)local_1c0,(Twine *)&local_178);
    value.Length = local_1c0._8_8_;
    value.Data = (char *)local_1c0._0_8_;
    key_00.Length = 0x10;
    key_00.Data = "LLBUILD_BUILD_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&local_118,key_00,value);
    if ((__hashtable_alloc *)local_1c0._0_8_ != (__hashtable_alloc *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
    }
    local_168 = (code *)CONCAT62(local_168._2_6_,0x10a);
    local_178._M_unused._M_member_pointer =
         local_178._M_unused._M_member_pointer & 0xffffffff00000000;
    local_150 = opaqueContext;
    llvm::Twine::str_abi_cxx11_((string *)local_1c0,(Twine *)&local_178);
    value_00.Length = local_1c0._8_8_;
    value_00.Data = (char *)local_1c0._0_8_;
    key_01.Length = 0xf;
    key_01.Data = "LLBUILD_LANE_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&local_118,key_01,value_00);
    if ((__hashtable_alloc *)local_1c0._0_8_ != (__hashtable_alloc *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
    }
    if (environment.Length != 0) {
      ppVar3 = ppVar4 + environment.Length;
      do {
        llbuild::basic::POSIXEnvironment::setIfMissing(&local_118,ppVar4->first,ppVar4->second);
        ppVar4 = ppVar4 + 1;
      } while (ppVar4 != ppVar3);
    }
    if ((attributes.inheritEnvironment != false) && (*this->environment != (char *)0x0)) {
      ppcVar1 = this->environment;
      do {
        ppcVar5 = ppcVar1 + 1;
        local_178._M_unused._M_object = *ppcVar1;
        if ((_func_void *)local_178._M_unused._0_8_ == (_func_void *)0x0) {
          local_178._8_8_ = 0;
        }
        else {
          local_178._8_8_ = strlen((char *)local_178._M_unused._0_8_);
        }
        local_198._M_pod_data[0] = 0x3d;
        Separator.Length = 1;
        Separator.Data = (char *)&local_198;
        llvm::StringRef::split
                  ((pair<llvm::StringRef,_llvm::StringRef> *)local_1c0,(StringRef *)&local_178,
                   Separator);
        key.Length = local_1c0._8_8_;
        key.Data = (char *)local_1c0._0_8_;
        value_01.Length = local_1c0._24_8_;
        value_01.Data = (char *)local_1c0._16_8_;
        llbuild::basic::POSIXEnvironment::setIfMissing(&local_118,key,value_01);
        ppcVar1 = ppcVar5;
      } while (*ppcVar5 != (char *)0x0);
    }
    pQVar2 = local_150;
    local_158.id = (uint64_t)local_150[1]._vptr_QueueJobContext;
    local_178._M_unused._M_object = (void *)0x0;
    local_178._8_8_ = 0;
    local_160 = std::
                _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:303:34)>
                ::_M_invoke;
    local_168 = std::
                _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:303:34)>
                ::_M_manager;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               local_1c0,&completionFn->Storage);
    local_188 = (code *)0x0;
    pcStack_180 = (code *)0x0;
    local_198._M_unused._M_object = (void *)0x0;
    local_198._8_8_ = 0;
    local_198._M_unused._M_object = operator_new(0x28);
    *(code *)((long)local_198._M_unused._0_8_ + 0x20) = local_1a0;
    if (local_1a0 == (code)0x1) {
      *(undefined8 *)local_198._M_unused._0_8_ = 0;
      *(undefined8 *)((long)local_198._M_unused._0_8_ + 8) = 0;
      *(undefined8 *)((long)local_198._M_unused._0_8_ + 0x10) = 0;
      *(undefined8 *)((long)local_198._M_unused._0_8_ + 0x18) = local_1c0._24_8_;
      if ((code *)local_1c0._16_8_ != (code *)0x0) {
        *(undefined8 *)local_198._M_unused._0_8_ = local_1c0._0_8_;
        *(undefined8 *)((long)local_198._M_unused._0_8_ + 8) = local_1c0._8_8_;
        *(undefined8 *)((long)local_198._M_unused._0_8_ + 0x10) = local_1c0._16_8_;
        local_1c0._16_8_ = (code *)0x0;
        local_1c0._24_8_ = 0;
      }
      pcStack_180 = std::
                    _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:309:7)>
                    ::_M_invoke;
      local_188 = std::
                  _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:309:7)>
                  ::_M_manager;
      if ((code *)local_1c0._16_8_ != (code *)0x0) {
        (*(code *)local_1c0._16_8_)(local_1c0,local_1c0,3);
      }
      local_1a0 = (code)0x0;
    }
    else {
      pcStack_180 = std::
                    _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:309:7)>
                    ::_M_invoke;
      local_188 = std::
                  _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:309:7)>
                  ::_M_manager;
    }
    if (delegate == (ProcessDelegate *)0x0) {
      delegate = &((this->super_ExecutionQueue).delegate)->super_ProcessDelegate;
    }
    ctx = (ProcessContext *)*pQVar2[2]._vptr_QueueJobContext;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_a0.env,&local_118.env);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0.envStorage,&local_118.envStorage);
    this_00 = &local_a0.keys;
    local_a0.keys._M_h._M_buckets = (__buckets_ptr)0x0;
    local_a0.keys._M_h._M_bucket_count = local_118.keys._M_h._M_bucket_count;
    local_a0.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0.keys._M_h._M_element_count = local_118.keys._M_h._M_element_count;
    local_a0.keys._M_h._M_rehash_policy._M_max_load_factor =
         local_118.keys._M_h._M_rehash_policy._M_max_load_factor;
    local_a0.keys._M_h._M_rehash_policy._4_4_ = local_118.keys._M_h._M_rehash_policy._4_4_;
    local_a0.keys._M_h._M_rehash_policy._M_next_resize =
         local_118.keys._M_h._M_rehash_policy._M_next_resize;
    local_a0.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_1c0._0_8_ = this_00;
    std::
    _Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<llvm::StringRef,true>>>>
              ((_Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00,&local_118.keys._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<llvm::StringRef,_true>_>_> *)
               local_1c0);
    local_a0.isFrozen = local_118.isFrozen;
    commandLine_00.Length = local_140;
    commandLine_00.Data = local_148;
    llbuild::basic::spawnProcess
              (delegate,ctx,&this->spawnedProcesses,local_158,commandLine_00,&local_a0,attributes,
               (ProcessReleaseFn *)&local_178,(ProcessCompletionFn *)&local_198);
    std::
    _Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&this_00->_M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0.envStorage);
    if (local_a0.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_188 != (code *)0x0) {
      (*local_188)(&local_198,&local_198,__destroy_functor);
    }
    if (local_168 != (code *)0x0) {
      (*local_168)(&local_178,&local_178,__destroy_functor);
    }
    std::
    _Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_118.keys._M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118.envStorage);
    if (local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else if ((completionFn->Storage).hasVal == true) {
    local_130 = 0;
    uStack_128 = 0;
    local_120 = 0;
    local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xffffffff00000002;
    local_118.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)CONCAT44(uStack_134,0xffffffff);
    local_118.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (*(long *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)
        == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
              (completionFn,&local_118);
  }
  return;
}

Assistant:

virtual void executeProcess(
      QueueJobContext* opaqueContext,
      ArrayRef<StringRef> commandLine,
      ArrayRef<std::pair<StringRef, StringRef>> environment,
      ProcessAttributes attributes,
      llvm::Optional<ProcessCompletionFn> completionFn,
      ProcessDelegate* delegate
  ) override {

    SerialContext& context = *reinterpret_cast<SerialContext*>(opaqueContext);

    // Do not execute new processes anymore after cancellation.
    if (cancelled) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessResult::makeCancelled());
      return;
    }

    // Form the complete environment.
    //
    // NOTE: We construct the environment in order of precedence, so
    // overridden keys should be defined first.
    POSIXEnvironment posixEnv;

    // Export lane ID to subprocesses.
    posixEnv.setIfMissing("LLBUILD_BUILD_ID", Twine(buildID).str());
    posixEnv.setIfMissing("LLBUILD_LANE_ID", Twine(0).str());

    // Add the requested environment.
    for (const auto& entry: environment) {
      posixEnv.setIfMissing(entry.first, entry.second);
    }

    // Inherit the base environment, if desired.
    //
    // FIXME: This involves a lot of redundant allocation, currently. We could
    // cache this for the common case of a directly inherited environment.
    if (attributes.inheritEnvironment) {
      for (const char* const* p = this->environment; *p != nullptr; ++p) {
        auto pair = StringRef(*p).split('=');
        posixEnv.setIfMissing(pair.first, pair.second);
      }
    }

    // Assign a process handle, which just needs to be unique for as long as we
    // are communicating with the delegate.
    ProcessHandle handle;
    handle.id = context.jobID;

    ProcessReleaseFn releaseFn = [](std::function<void()>&& processWait) {
      // not allowed to release, call wait directly
      processWait();
    };

    ProcessCompletionFn laneCompletionFn{
      [completionFn](ProcessResult result) mutable {
        if (completionFn.hasValue())
          completionFn.getValue()(result);
      }
    };

    spawnProcess(
        delegate ? *delegate : getDelegate(),
        reinterpret_cast<ProcessContext*>(context.job.getDescriptor()),
        spawnedProcesses,
        handle,
        commandLine,
        posixEnv,
        attributes,
        std::move(releaseFn),
        std::move(laneCompletionFn)
    );
  }